

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID ImGui::DockContextGenNodeID(ImGuiContext_conflict1 *ctx)

{
  void *pvVar1;
  ImGuiID key;
  
  key = 0;
  do {
    key = key + 1;
    pvVar1 = ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,key);
  } while (pvVar1 != (void *)0x0);
  return key;
}

Assistant:

ImGuiID ImGui::DockContextGenNodeID(ImGuiContext* ctx)
{
    // Generate an ID for new node (the exact ID value doesn't matter as long as it is not already used)
    // FIXME-OPT FIXME-DOCK: This is suboptimal, even if the node count is small enough not to be a worry.0
    // We should poke in ctx->Nodes to find a suitable ID faster. Even more so trivial that ctx->Nodes lookup is already sorted.
    ImGuiID id = 0x0001;
    while (DockContextFindNodeByID(ctx, id) != NULL)
        id++;
    return id;
}